

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

aiBone * findBone(aiScene *scene,char *name)

{
  aiMesh *paVar1;
  aiBone *this;
  int iVar2;
  char *__s2;
  aiBone *bone;
  size_t b;
  aiMesh *mesh;
  size_t m;
  char *name_local;
  aiScene *scene_local;
  
  mesh = (aiMesh *)0x0;
  do {
    if ((aiMesh *)(ulong)scene->mNumMeshes <= mesh) {
      return (aiBone *)0x0;
    }
    paVar1 = scene->mMeshes[(long)mesh];
    for (bone = (aiBone *)0x0; bone < (aiBone *)(ulong)paVar1->mNumBones;
        bone = (aiBone *)((long)&(bone->mName).length + 1)) {
      this = paVar1->mBones[(long)bone];
      __s2 = aiString::C_Str(&this->mName);
      iVar2 = strcmp(name,__s2);
      if (iVar2 == 0) {
        return this;
      }
    }
    mesh = (aiMesh *)((long)&mesh->mPrimitiveTypes + 1);
  } while( true );
}

Assistant:

aiBone* findBone( const aiScene* scene, const char * name) {
    for (size_t m=0; m<scene->mNumMeshes; m++) {
        aiMesh * mesh = scene->mMeshes[m];
        for (size_t b=0; b<mesh->mNumBones; b++) {
            aiBone * bone = mesh->mBones[b];
            if (0 == strcmp(name, bone->mName.C_Str())) {
                return bone;
            }
        }
    }
    return NULL;
}